

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed.c
# Opt level: O0

int marktime(int *status)

{
  int *in_RDI;
  timeval tv;
  time_t temp;
  double telapse;
  timeval local_28;
  time_t local_18;
  undefined8 local_10;
  int *local_8;
  
  local_8 = in_RDI;
  local_18 = time((time_t *)0x0);
  local_10 = 0;
  scpu = clock();
  start = time((time_t *)0x0);
  gettimeofday(&local_28,(__timezone_ptr_t)0x0);
  startsec = local_28.tv_sec;
  startmilli = (int)(local_28.tv_usec / 1000);
  return *local_8;
}

Assistant:

int marktime( int *status)
{
    double telapse;
    time_t temp;
    struct  timeval tv;

    temp = time(0);

    /* Since elapsed time is only measured to the nearest second */
    /* keep getting the time until the seconds tick just changes. */
    /* This provides more consistent timing measurements since the */
    /* intervals all start on an integer seconds. */

    telapse = 0.;

        scpu = clock();
        start = time(0);
/*
    while (telapse == 0.)
    {
        scpu = clock();
        start = time(0);
        telapse = difftime( start, temp );
    }
*/
        gettimeofday (&tv, NULL);

	startsec = tv.tv_sec;
        startmilli = tv.tv_usec/1000;

    return( *status );
}